

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_strategy.h
# Opt level: O0

void __thiscall
charls::encoder_strategy::encoder_strategy
          (encoder_strategy *this,frame_info *info,coding_parameters *parameters)

{
  uint32_t uVar1;
  int32_t iVar2;
  color_transformation cVar3;
  undefined3 uVar4;
  coding_parameters *parameters_local;
  frame_info *info_local;
  encoder_strategy *this_local;
  
  this->_vptr_encoder_strategy = (_func_int **)&PTR__encoder_strategy_0017da40;
  uVar1 = info->height;
  (this->frame_info_).width = info->width;
  (this->frame_info_).height = uVar1;
  iVar2 = info->component_count;
  (this->frame_info_).bits_per_sample = info->bits_per_sample;
  (this->frame_info_).component_count = iVar2;
  uVar1 = parameters->restart_interval;
  (this->parameters_).near_lossless = parameters->near_lossless;
  (this->parameters_).restart_interval = uVar1;
  cVar3 = parameters->transformation;
  (this->parameters_).interleave_mode = parameters->interleave_mode;
  (this->parameters_).transformation = cVar3;
  uVar4 = *(undefined3 *)&parameters->field_0x11;
  (this->parameters_).output_bgr = parameters->output_bgr;
  *(undefined3 *)&(this->parameters_).field_0x11 = uVar4;
  std::unique_ptr<charls::decoder_strategy,std::default_delete<charls::decoder_strategy>>::
  unique_ptr<std::default_delete<charls::decoder_strategy>,void>
            ((unique_ptr<charls::decoder_strategy,std::default_delete<charls::decoder_strategy>> *)
             &this->decoder_);
  std::unique_ptr<charls::process_line,std::default_delete<charls::process_line>>::
  unique_ptr<std::default_delete<charls::process_line>,void>
            ((unique_ptr<charls::process_line,std::default_delete<charls::process_line>> *)
             &this->process_line_);
  this->bit_buffer_ = 0;
  this->free_bit_count_ = 0x20;
  this->compressed_length_ = 0;
  this->position_ = (uint8_t *)0x0;
  this->is_ff_written_ = false;
  this->bytes_written_ = 0;
  return;
}

Assistant:

encoder_strategy(const frame_info& info, const coding_parameters& parameters) noexcept :
        frame_info_{info}, parameters_{parameters}
    {
    }